

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O1

void __thiscall Spi::check_rx(Spi *this)

{
  undefined1 uVar1;
  uint in_EAX;
  int iVar2;
  ostream *poVar3;
  BYTE byInputBuffer [1];
  DWORD dwNumBytesRead;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  iVar2 = FT_Read(this->ftHandle,(long)&uStack_38 + 2,1);
  if (iVar2 == 0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unexpected rx byte: ",0x14);
      uVar1 = uStack_38._2_1_;
      uStack_38._0_4_ = CONCAT13(uVar1,(undefined3)uStack_38);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)((long)&uStack_38 + 3),1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      iVar2 = FT_Read(this->ftHandle,(long)&uStack_38 + 2,1,(long)&uStack_38 + 4);
    } while (iVar2 == 0);
  }
  return;
}

Assistant:

void Spi::check_rx() {
	FT_STATUS ftStatus;
	BYTE byInputBuffer[1];
	DWORD dwNumBytesRead = 0;

	while (1) {
		ftStatus = FT_Read(ftHandle, &byInputBuffer, 1, &dwNumBytesRead);
		if (ftStatus != FT_OK)
			break;
		cerr << "Unexpected rx byte: " << byInputBuffer[0] << endl;
	}
}